

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskablock.c
# Opt level: O2

err_t MATROSKA_BlockProcessFrameDurations(matroska_block *Block,stream *Input,int ForProfile)

{
  byte bVar1;
  size_t sVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  ebml_context *peVar7;
  ebml_integer *Element;
  int64_t iVar8;
  ebml_string *Element_00;
  bool_t bVar9;
  long lVar10;
  undefined8 uVar11;
  ebml_master *peVar12;
  ebml_element *peVar13;
  ebml_binary *Element_01;
  byte *pbVar14;
  char *pcVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  long lStack_220;
  ebml_master *Track;
  long local_210;
  long local_208;
  ogg_packet local_200;
  ogg_reference local_1d0;
  ogg_buffer OggBuffer;
  vorbis_comment vc;
  vorbis_info vi;
  tchar_t CodecID [256];
  
  Track = (ebml_master *)0x0;
  if (Block == (matroska_block *)0x0) {
    pcVar15 = "(const void*)(Block)!=NULL";
    uVar17 = 0x3b;
LAB_0011341e:
    __assert_fail(pcVar15,
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                  ,uVar17,
                  "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                 );
  }
  lStack_220 = (**(code **)((long)(Block->Base).Base.Base.Base.VMT + 0x18))(Block,0x180,&Track);
  peVar12 = Track;
  if (lStack_220 == 0) {
    if (Track == (ebml_master *)0x0) {
      pcVar15 = "Track!=NULL";
      uVar17 = 0x3e;
      goto LAB_0011341e;
    }
    peVar7 = MATROSKA_getContextTrackType();
    Element = (ebml_integer *)EBML_MasterFindFirstElt(peVar12,peVar7,0,0,0);
    lStack_220 = -3;
    if ((Element != (ebml_integer *)0x0) &&
       (iVar8 = EBML_IntegerValue(Element), peVar12 = Track, lStack_220 = -3, iVar8 == 2)) {
      if (Block->FirstFrameLocation == 0) {
        lStack_220 = -0x15;
      }
      else {
        peVar7 = MATROSKA_getContextCodecID();
        Element_00 = (ebml_string *)EBML_MasterFindFirstElt(peVar12,peVar7,0,0,0);
        if (Element_00 != (ebml_string *)0x0) {
          EBML_StringGet(Element_00,CodecID,0x100);
          sVar2 = (Block->Data)._Used;
          if ((sVar2 != 0) ||
             (lStack_220 = MATROSKA_BlockReadData(Block,Input,ForProfile), lStack_220 == 0)) {
            bVar9 = tcsisame_ascii(CodecID,"A_MPEG/L3");
            if ((bVar9 == 0) &&
               ((bVar9 = tcsisame_ascii(CodecID,"A_MPEG/L2"), bVar9 == 0 &&
                (bVar9 = tcsisame_ascii(CodecID,"A_MPEG/L1"), bVar9 == 0)))) {
              bVar9 = tcsisame_ascii(CodecID,"A_AC3");
              if (bVar9 == 0) {
                bVar9 = tcsisame_ascii(CodecID,"A_EAC3");
                if (bVar9 == 0) {
                  bVar9 = tcsisame_ascii(CodecID,"A_DTS");
                  if (bVar9 == 0) {
                    bVar9 = tcsisame_ascii(CodecID,"A_AAC");
                    if ((bVar9 == 0) && (iVar18 = tcsncmp(CodecID,"A_AAC/",6), iVar18 != 0)) {
                      bVar9 = tcsisame_ascii(CodecID,"A_VORBIS");
                      peVar12 = Track;
                      if (bVar9 == 0) {
                        lStack_220 = 0;
                      }
                      else {
                        Block->IsKeyframe = 1;
                        peVar7 = MATROSKA_getContextCodecPrivate();
                        lStack_220 = 0;
                        Element_01 = (ebml_binary *)EBML_MasterFindFirstElt(peVar12,peVar7,0,0,0);
                        if (Element_01 != (ebml_binary *)0x0) {
                          vorbis_info_init(&vi);
                          vorbis_comment_init(&vc);
                          local_200.e_o_s = 0;
                          local_200.granulepos = 0;
                          local_200.bytes = 0;
                          local_200.b_o_s = 0;
                          pbVar14 = EBML_BinaryGetData(Element_01);
                          OggBuffer.data = pbVar14;
                          OggBuffer.size = EBML_ElementDataSize((ebml_element *)Element_01,1);
                          OggBuffer.refcount = 1;
                          local_200.packet = &local_1d0;
                          local_1d0.begin = 0;
                          local_1d0.length = 0;
                          local_1d0.next = (ogg_reference *)0x0;
                          local_200.packetno = -1;
                          bVar1 = *pbVar14;
                          iVar18 = bVar1 + 1;
                          lVar16 = 1;
                          local_1d0.buffer = &OggBuffer;
                          while ((lVar10 = (long)iVar18, local_200.packetno < 3 &&
                                 ((int)lVar16 <= (int)(uint)bVar1))) {
                            local_1d0.length = 0;
                            lVar19 = (long)(int)lVar16;
                            do {
                              local_1d0.length = (ulong)OggBuffer.data[lVar19] + local_1d0.length;
                              lVar16 = lVar19 + 1;
                              if (OggBuffer.data[lVar19] != 0xff) break;
                              bVar3 = lVar19 < (long)(ulong)bVar1;
                              lVar19 = lVar16;
                            } while (bVar3);
                            iVar18 = iVar18 + (int)local_1d0.length;
                            if (OggBuffer.size < iVar18) {
                              return -3;
                            }
                            local_200.packetno = local_200.packetno + 1;
                            local_200.b_o_s = (long)(local_200.packetno == 0);
                            local_200.bytes = (local_200.packet)->length;
                            local_1d0.begin = lVar10;
                            iVar6 = vorbis_synthesis_headerin(&vi,&vc,&local_200);
                            if (iVar6 < 0 && local_200.packetno == 0) {
                              return -3;
                            }
                          }
                          if (local_200.packetno < 3) {
                            local_1d0.length = OggBuffer.size - lVar10;
                            local_200.packetno = local_200.packetno + 1;
                            local_200.b_o_s = (long)(local_200.packetno == 0);
                            local_200.bytes = (local_200.packet)->length;
                            local_1d0.begin = lVar10;
                            iVar18 = vorbis_synthesis_headerin(&vi,&vc,&local_200);
                            if ((iVar18 < 0) && (local_200.packetno == 0)) {
                              return -3;
                            }
                          }
                          ArrayResize(&Block->Durations,
                                      (Block->SizeList)._Used * 2 & 0xfffffffffffffff8,0);
                          pbVar14 = (byte *)(Block->Data)._Begin;
                          local_208 = vi.rate << 0x20;
                          local_210 = (long)(int)vi.rate;
                          lStack_220 = 0;
                          for (uVar22 = 0; uVar22 < (Block->SizeList)._Used >> 2;
                              uVar22 = uVar22 + 1) {
                            iVar18 = _ilog(*(int *)((long)vi.codec_setup + 0x10) - 1);
                            uVar17 = (*pbVar14 & 0x7f) >> (7U - (char)iVar18 & 0x1f);
                            iVar18 = *(int *)((long)vi.codec_setup + 0x10);
                            lVar16 = lStack_220;
                            if (iVar18 < (int)uVar17) {
                              lVar16 = -3;
                            }
                            lVar10 = 0;
                            if (iVar18 < (int)uVar17) {
                              lVar10 = 0x7fffffffffffffff;
                            }
                            if (local_208 != 0 && (int)uVar17 <= iVar18) {
                              lVar10 = ((long)*(int *)((long)vi.codec_setup +
                                                      (long)**(int **)((long)vi.codec_setup +
                                                                      (ulong)uVar17 * 8 + 0x28) * 8)
                                       * 1000000000) / local_210;
                              lVar16 = lStack_220;
                            }
                            *(long *)((Block->Durations)._Begin + uVar22 * 8) = lVar10;
                            pbVar14 = pbVar14 + *(int *)((Block->SizeList)._Begin + uVar22 * 4);
                            lStack_220 = lVar16;
                          }
                          vorbis_comment_clear(&vc);
                          vorbis_info_clear(&vi);
                        }
                      }
                    }
                    else {
                      peVar12 = Track;
                      Block->IsKeyframe = 1;
                      peVar7 = MATROSKA_getContextAudio();
                      lStack_220 = 0;
                      peVar12 = (ebml_master *)EBML_MasterFindFirstElt(peVar12,peVar7,0,0,0);
                      if (peVar12 != (ebml_master *)0x0) {
                        peVar7 = MATROSKA_getContextSamplingFrequency();
                        lStack_220 = 0;
                        peVar13 = EBML_MasterFindFirstElt(peVar12,peVar7,0,0,0);
                        if (peVar13 != (ebml_element *)0x0) {
                          lStack_220 = 0;
                          ArrayResize(&Block->Durations,
                                      (Block->SizeList)._Used * 2 & 0xfffffffffffffff8,0);
                          iVar18 = (int)*(double *)&peVar13[1].Base.Base;
                          for (uVar22 = 0; uVar22 < (Block->SizeList)._Used >> 2;
                              uVar22 = uVar22 + 1) {
                            if (iVar18 == 0) {
                              uVar11 = 0;
                            }
                            else {
                              uVar11 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xee6b280000)) /
                                              SEXT816((long)iVar18),0);
                            }
                            *(undefined8 *)((Block->Durations)._Begin + uVar22 * 8) = uVar11;
                          }
                        }
                      }
                    }
                  }
                  else {
                    Block->IsKeyframe = 1;
                    ArrayResize(&Block->Durations,(Block->SizeList)._Used * 2 & 0xfffffffffffffff8,0
                               );
                    pcVar15 = (Block->Data)._Begin;
                    lStack_220 = 0;
                    for (uVar22 = 0; uVar22 < (Block->SizeList)._Used >> 2; uVar22 = uVar22 + 1) {
                      uVar17 = (byte)pcVar15[8] >> 2 & 0xf;
                      uVar11 = 0x7fffffffffffffff;
                      lVar16 = -3;
                      if ((0xc631U >> uVar17 & 1) == 0) {
                        auVar4._8_8_ = 0;
                        auVar4._0_8_ = (ulong)(byte)((byte)pcVar15[5] >> 2 | pcVar15[4] << 7) *
                                       32000000000 + 32000000000;
                        uVar11 = SUB168(auVar4 / SEXT816((long)A_DTS_freq[uVar17]),0);
                        lVar16 = lStack_220;
                      }
                      *(undefined8 *)((Block->Durations)._Begin + uVar22 * 8) = uVar11;
                      pcVar15 = pcVar15 + *(int *)((Block->SizeList)._Begin + uVar22 * 4);
                      lStack_220 = lVar16;
                    }
                  }
                }
                else {
                  Block->IsKeyframe = 1;
                  ArrayResize(&Block->Durations,(Block->SizeList)._Used * 2 & 0xfffffffffffffff8,0);
                  pcVar15 = (Block->Data)._Begin;
                  lStack_220 = 0;
                  for (uVar22 = 0; uVar22 < (Block->SizeList)._Used >> 2; uVar22 = uVar22 + 1) {
                    uVar20 = (uint)((byte)pcVar15[4] >> 6);
                    uVar17 = (byte)pcVar15[4] >> 4 & 3;
                    lVar10 = 0x7fffffffffffffff;
                    lVar16 = -3;
                    if (uVar17 != 3 || uVar20 != 3) {
                      lVar10 = 0x165a0bc0000;
                      uVar5 = uVar17 + 3;
                      if (uVar20 != 3) {
                        uVar5 = uVar20;
                      }
                      if (uVar20 != 3) {
                        lVar10 = (long)A_EAC3_samples[uVar17] * 1000000000;
                      }
                      lVar10 = lVar10 / (long)A_EAC3_freq[uVar5];
                      lVar16 = lStack_220;
                    }
                    *(long *)((Block->Durations)._Begin + uVar22 * 8) = lVar10;
                    pcVar15 = pcVar15 + *(int *)((Block->SizeList)._Begin + uVar22 * 4);
                    lStack_220 = lVar16;
                  }
                }
              }
              else {
                Block->IsKeyframe = 1;
                ArrayResize(&Block->Durations,(Block->SizeList)._Used * 2 & 0xfffffffffffffff8,0);
                pcVar15 = (Block->Data)._Begin;
                lStack_220 = 0;
                for (uVar22 = 0; uVar22 < (Block->SizeList)._Used >> 2; uVar22 = uVar22 + 1) {
                  uVar11 = 0x7fffffffffffffff;
                  lVar16 = -3;
                  if (0xe7 < (byte)(pcVar15[5] + 0xa8U)) {
                    lVar10 = (long)*(int *)((long)A_AC3_freq[0] +
                                           (ulong)((byte)pcVar15[4] >> 6) * 4 +
                                           (ulong)((byte)pcVar15[5] & 0x18) * 2);
                    lVar16 = lStack_220;
                    if (lVar10 == 0) {
                      uVar11 = 0;
                    }
                    else {
                      uVar11 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x165a0bc0000)) /
                                      SEXT816(lVar10),0);
                    }
                  }
                  *(undefined8 *)((Block->Durations)._Begin + uVar22 * 8) = uVar11;
                  pcVar15 = pcVar15 + *(int *)((Block->SizeList)._Begin + uVar22 * 4);
                  lStack_220 = lVar16;
                }
              }
            }
            else {
              Block->IsKeyframe = 1;
              ArrayResize(&Block->Durations,(Block->SizeList)._Used * 2 & 0xfffffffffffffff8,0);
              pcVar15 = (Block->Data)._Begin;
              lStack_220 = 0;
              for (uVar22 = 0; uVar22 < (Block->SizeList)._Used >> 2; uVar22 = uVar22 + 1) {
                uVar21 = (ulong)((byte)pcVar15[1] >> 1 & 0xc);
                lVar19 = (long)*(int *)((long)A_MPEG_freq[0] +
                                       uVar21 + (ulong)((byte)pcVar15[2] & 0xc) * 4);
                lVar10 = 0x7fffffffffffffff;
                lVar16 = -3;
                if (lVar19 != 0) {
                  iVar18 = *(int *)((long)A_MPEG_samples[0] +
                                   uVar21 + (ulong)((byte)pcVar15[1] & 6) * 8);
                  lVar10 = 0x7fffffffffffffff;
                  if (iVar18 != 0) {
                    lVar10 = ((long)iVar18 * 1000000000) / lVar19;
                    lVar16 = lStack_220;
                  }
                }
                *(long *)((Block->Durations)._Begin + uVar22 * 8) = lVar10;
                pcVar15 = pcVar15 + *(int *)((Block->SizeList)._Begin + uVar22 * 4);
                lStack_220 = lVar16;
              }
            }
            if (sVar2 == 0) {
              ArrayClear(&Block->Data);
              (Block->Base).Base.bValueIsSet = '\0';
            }
          }
        }
      }
    }
  }
  return lStack_220;
}

Assistant:

err_t MATROSKA_BlockProcessFrameDurations(matroska_block *Block, struct stream *Input, int ForProfile)
{
    ebml_master *Track=NULL;
    ebml_element *Elt;
    tchar_t CodecID[MAXPATH];
    err_t Err;
    bool_t ReadData;
    uint8_t *Cursor;
    size_t Frame;
    int Version, Layer, SampleRate, Samples, fscod, fscod2;

    Err = Node_GET(Block,MATROSKA_BLOCK_READ_TRACK,&Track);
    if (Err==ERR_NONE)
    {
        assert(Track!=NULL);
        Elt = EBML_MasterFindChild(Track,MATROSKA_getContextTrackType());
        if (!Elt || EBML_IntegerValue((ebml_integer*)Elt)!=MATROSKA_TRACK_TYPE_AUDIO) // other track types not supported for now
            Err = ERR_INVALID_DATA;
        else
        {
            if (Block->FirstFrameLocation==0)
                Err = ERR_READ;
            else
            {
                Elt = EBML_MasterFindChild(Track,MATROSKA_getContextCodecID());
                if (!Elt) // missing codec ID
                    Err = ERR_INVALID_DATA;
                else
                {
                    EBML_StringGet((ebml_string*)Elt,CodecID,TSIZEOF(CodecID));
                    ReadData = 0;
                    if (!ARRAYCOUNT(Block->Data,uint8_t))
                    {
                        Err = MATROSKA_BlockReadData(Block,Input,ForProfile);
                        if (Err!=ERR_NONE)
                            goto exit;
                        ReadData = 1;
                    }

                    if (tcsisame_ascii(CodecID,T("A_MPEG/L3")) || tcsisame_ascii(CodecID,T("A_MPEG/L2")) || tcsisame_ascii(CodecID,T("A_MPEG/L1")))
                    {
                        Block->IsKeyframe = 1; // safety
                        ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                        Cursor = ARRAYBEGIN(Block->Data,uint8_t);
                        for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                        {
                            Version = (Cursor[1] >> 3) & 3;
                            Layer = (Cursor[1] >> 1) & 3;
                            SampleRate = (Cursor[2] >> 2) & 3;

                            Samples = A_MPEG_samples[Layer][Version];
                            SampleRate = A_MPEG_freq[SampleRate][Version];
                            if (SampleRate!=0 && Samples!=0)
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,Samples,SampleRate);
                            else
                            {
                                Err = ERR_INVALID_DATA;
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = INVALID_TIMESTAMP_T;
                                //goto exit;
                            }

                            Cursor += ARRAYBEGIN(Block->SizeList,int32_t)[Frame];
                        }
                    }
                    else if (tcsisame_ascii(CodecID,T("A_AC3")))
                    {
                        Block->IsKeyframe = 1; // safety
                        ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                        Cursor = ARRAYBEGIN(Block->Data,uint8_t);
                        for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                        {
                            fscod =  Cursor[5] >> 3;
                            SampleRate = Cursor[4] >> 6;
                            if (fscod > 10 || fscod < 8)
                            {
                                Err = ERR_INVALID_DATA;
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = INVALID_TIMESTAMP_T;
                                //goto exit;
                            }
                            else
                            {
                                SampleRate = A_AC3_freq[fscod-8][SampleRate];
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,1536,SampleRate);
                            }
                            Cursor += ARRAYBEGIN(Block->SizeList,int32_t)[Frame];
                        }
                    }
                    else if (tcsisame_ascii(CodecID,T("A_EAC3")))
                    {
                        Block->IsKeyframe = 1; // safety
                        ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                        Cursor = ARRAYBEGIN(Block->Data,uint8_t);
                        for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                        {
                            fscod =  Cursor[4] >> 6;
                            fscod2 = (Cursor[4] >> 4) & 0x03;
                            if ((0x03 == fscod) && (0x03 == fscod2))
                            {
                                Err = ERR_INVALID_DATA;
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = INVALID_TIMESTAMP_T;
                                //goto exit;
                            }
                            else
                            {
                                SampleRate = A_EAC3_freq[0x03 == fscod ? 3 + fscod2 : fscod];
                                Samples = (0x03 == fscod) ? 1536 : A_EAC3_samples[fscod2];
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,Samples,SampleRate);
                            }
                            Cursor += ARRAYBEGIN(Block->SizeList,int32_t)[Frame];
                        }
                    }
                    else if (tcsisame_ascii(CodecID,T("A_DTS")))
                    {
                        Block->IsKeyframe = 1; // safety
                        ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                        Cursor = ARRAYBEGIN(Block->Data,uint8_t);
                        for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                        {
                            Samples = (((Cursor[4] & 1) << 7) + (Cursor[5] >> 2) + 1) * 32;
                            // TODO: handle the frame termination
                            SampleRate = A_DTS_freq[(Cursor[8] >> 2) & 0x0F];
                            if (Samples==0 || SampleRate==0)
                            {
                                Err = ERR_INVALID_DATA;
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = INVALID_TIMESTAMP_T;
                                //goto exit;
                            }
                            else
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,Samples,SampleRate);
                            Cursor += ARRAYBEGIN(Block->SizeList,int32_t)[Frame];
                        }
                    }
                    else if (tcsisame_ascii(CodecID,T("A_AAC")) || tcsncmp(CodecID,T("A_AAC/"),6)==0)
                    {
                        Block->IsKeyframe = 1; // safety
                        Elt = EBML_MasterFindChild(Track,MATROSKA_getContextAudio());
                        if (Elt)
                        {
                            Elt = EBML_MasterFindChild((ebml_master*)Elt,MATROSKA_getContextSamplingFrequency());
                            if (Elt)
                            {
                                ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                                Samples = 1024;
                                SampleRate = (int)((ebml_float*)Elt)->Value;
                                for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                                    ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,Samples,SampleRate);
                            }
                        }
                    }
#if defined(CONFIG_CODEC_HELPER)
                    else if (tcsisame_ascii(CodecID,T("A_VORBIS")))
                    {
                        Block->IsKeyframe = 1; // safety
                        Elt = EBML_MasterFindChild(Track,MATROSKA_getContextCodecPrivate());
                        if (Elt)
                        {
                            vorbis_info vi;
                            vorbis_comment vc;
                            ogg_packet OggPacket;
                        	ogg_reference OggRef;
                        	ogg_buffer OggBuffer;
                            int n,i,j;
                            codec_setup_info *ci;

		                    vorbis_info_init(&vi);
		                    vorbis_comment_init(&vc);
                            memset(&OggPacket,0,sizeof(ogg_packet));

		                    OggBuffer.data = (uint8_t*)EBML_BinaryGetData((ebml_binary*)Elt);
		                    OggBuffer.size = (long)EBML_ElementDataSize(Elt, 1);
		                    OggBuffer.refcount = 1;

                            memset(&OggRef,0,sizeof(OggRef));
		                    OggRef.buffer = &OggBuffer;
		                    OggRef.next = NULL;

		                    OggPacket.packet = &OggRef;
		                    OggPacket.packetno = -1;

		                    n = OggBuffer.data[0];
		                    i = 1+n;
		                    j = 1;

		                    while (OggPacket.packetno < 3 && n>=j)
		                    {
			                    OggRef.begin = i;
			                    OggRef.length = 0;
			                    do
			                    {
				                    OggRef.length += OggBuffer.data[j];
			                    }
			                    while (OggBuffer.data[j++] == 255 && n>=j);
			                    i += OggRef.length;

			                    if (i > OggBuffer.size)
				                    return ERR_INVALID_DATA;

	                            ++OggPacket.packetno;
	                            OggPacket.b_o_s = OggPacket.packetno == 0;
	                            OggPacket.bytes = OggPacket.packet->length;
			                    if (!(vorbis_synthesis_headerin(&vi,&vc,&OggPacket) >= 0) && OggPacket.packetno==0)
				                    return ERR_INVALID_DATA;
		                    }

		                    if (OggPacket.packetno < 3)
		                    {
			                    OggRef.begin = i;
			                    OggRef.length = OggBuffer.size - i;

	                            ++OggPacket.packetno;
	                            OggPacket.b_o_s = OggPacket.packetno == 0;
	                            OggPacket.bytes = OggPacket.packet->length;

                                if (!(vorbis_synthesis_headerin(&vi,&vc,&OggPacket) >= 0) && OggPacket.packetno==0)
				                    return ERR_INVALID_DATA;
                            }

                            SampleRate = vi.rate;
                            ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                            Cursor = ARRAYBEGIN(Block->Data,uint8_t);
                            ci = vi.codec_setup;
                            for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                            {
                                fscod = _ilog(ci->modes-1);
                                fscod = (Cursor[0] & 0x7F) >> (7-fscod);
                                if (fscod > ci->modes)
                                {
                                    Err = ERR_INVALID_DATA;
                                    ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = INVALID_TIMESTAMP_T;
                                    //goto exit;
                                }
                                else
                                {
                                    Samples = ci->blocksizes[ci->mode_param[fscod]->blockflag];
                                    ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,Samples,SampleRate);
                                }
                                Cursor += ARRAYBEGIN(Block->SizeList,int32_t)[Frame];
                            }
                            vorbis_comment_clear(&vc);
                            vorbis_info_clear(&vi);
                        }
                    }
#endif

                    if (ReadData)
                    {
                        ArrayClear(&Block->Data);
                        Block->Base.Base.bValueIsSet = 0;
                    }
                }
            }
        }
    }
exit:
    return Err;
}